

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateBiDirectionalLSTMLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  void *pvVar3;
  bool bVar4;
  undefined1 *puVar5;
  long *plVar6;
  uint32_t uVar7;
  size_type *psVar8;
  undefined1 *puVar9;
  Result *_result;
  long lVar10;
  long lVar11;
  InternalMetadata *pIVar12;
  string err;
  BiDirectionalLSTMLayerParams recurrent;
  LSTMParams lstmParams;
  string local_190;
  string local_170;
  uint64_t local_150;
  Type *local_148;
  Type *local_140;
  uint64_t local_138;
  string local_130;
  uint64_t local_110;
  string local_108;
  undefined1 local_e8 [48];
  int local_b8;
  RepeatedPtrFieldBase local_a8;
  LSTMParams *local_90;
  uint64_t local_88;
  uint64_t local_80;
  LSTMParams local_70;
  LSTMParams local_50;
  
  validateInputCount(__return_storage_ptr__,layer,1,5);
  bVar4 = Result::good(__return_storage_ptr__);
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  validateOutputCount(__return_storage_ptr__,layer,5,5);
  bVar4 = Result::good(__return_storage_ptr__);
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  if (this->ndArrayInterpretation == true) {
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"BiDirectionalLSTM","");
    validateInputOutputRankEquality(__return_storage_ptr__,layer,&local_108,&this->blobNameToRank);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    bVar4 = Result::good(__return_storage_ptr__);
    if (!bVar4) {
      return __return_storage_ptr__;
    }
    pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar1) {
      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
    }
    local_e8._0_8_ = local_e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"BiDirectionalLSTM","");
    validateRankCount(__return_storage_ptr__,layer,(string *)local_e8,5,5,&this->blobNameToRank);
    if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
      operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
    }
    bVar4 = Result::good(__return_storage_ptr__);
    if (!bVar4) {
      return __return_storage_ptr__;
    }
    pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar1) {
      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
    }
  }
  uVar7 = layer->_oneof_case_[0];
  puVar5 = *(undefined1 **)&layer->layer_;
  puVar9 = puVar5;
  if (uVar7 != 0x1ae) {
    puVar9 = Specification::_BiDirectionalLSTMLayerParams_default_instance_;
  }
  pIVar12 = &(((BatchnormLayerParams *)puVar9)->mean_->super_MessageLite)._internal_metadata_;
  if (((BatchnormLayerParams *)puVar9)->mean_ == (WeightParams *)0x0) {
    pIVar12 = (InternalMetadata *)0x0;
  }
  lVar10 = (long)*(int *)&(((ConvolutionLayerParams *)puVar9)->kernelsize_).arena_or_elements_;
  if (lVar10 != 0) {
    lVar11 = 0;
    do {
      validateRecurrentActivationParams
                (__return_storage_ptr__,*(ActivationParams **)((long)&pIVar12->ptr_ + lVar11));
      bVar4 = Result::good(__return_storage_ptr__);
      if (!bVar4) {
        return __return_storage_ptr__;
      }
      pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != paVar1) {
        operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
      }
      lVar11 = lVar11 + 8;
    } while (lVar10 * 8 != lVar11);
    uVar7 = layer->_oneof_case_[0];
    puVar5 = *(undefined1 **)&layer->layer_;
  }
  puVar9 = puVar5;
  if (uVar7 != 0x1ae) {
    puVar9 = Specification::_BiDirectionalLSTMLayerParams_default_instance_;
  }
  pIVar12 = &(((GRULayerParams *)puVar9)->outputgateweightmatrix_->super_MessageLite).
             _internal_metadata_;
  if (((GRULayerParams *)puVar9)->outputgateweightmatrix_ == (WeightParams *)0x0) {
    pIVar12 = (InternalMetadata *)0x0;
  }
  lVar10 = (long)*(int *)&(((ConvolutionLayerParams *)puVar9)->stride_).arena_or_elements_;
  if (lVar10 != 0) {
    lVar11 = 0;
    do {
      validateRecurrentActivationParams
                (__return_storage_ptr__,*(ActivationParams **)((long)&pIVar12->ptr_ + lVar11));
      bVar4 = Result::good(__return_storage_ptr__);
      if (!bVar4) {
        return __return_storage_ptr__;
      }
      pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != paVar1) {
        operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
      }
      lVar11 = lVar11 + 8;
    } while (lVar10 * 8 != lVar11);
    uVar7 = layer->_oneof_case_[0];
    puVar5 = *(undefined1 **)&layer->layer_;
  }
  if (uVar7 != 0x1a4) {
    puVar5 = Specification::_UniDirectionalLSTMLayerParams_default_instance_;
  }
  puVar9 = (undefined1 *)((UniDirectionalLSTMLayerParams *)puVar5)->params_;
  puVar5 = (undefined1 *)((UniDirectionalLSTMLayerParams *)puVar5)->weightparams_;
  if ((LSTMWeightParams *)puVar5 == (LSTMWeightParams *)0x0) {
    puVar5 = Specification::_LSTMWeightParams_default_instance_;
  }
  if ((LSTMParams *)puVar9 == (LSTMParams *)0x0) {
    puVar9 = Specification::_LSTMParams_default_instance_;
  }
  Specification::LSTMParams::LSTMParams(&local_50,(LSTMParams *)puVar9);
  validateLSTMWeightParams(__return_storage_ptr__,(LSTMWeightParams *)puVar5,&local_50);
  Specification::LSTMParams::~LSTMParams(&local_50);
  bVar4 = Result::good(__return_storage_ptr__);
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  if (layer->_oneof_case_[0] == 0x1ae) {
    puVar5 = *(undefined1 **)&layer->layer_;
  }
  else {
    puVar5 = Specification::_BiDirectionalLSTMLayerParams_default_instance_;
  }
  Specification::BiDirectionalLSTMLayerParams::BiDirectionalLSTMLayerParams
            ((BiDirectionalLSTMLayerParams *)local_e8,(BiDirectionalLSTMLayerParams *)puVar5);
  puVar5 = (undefined1 *)local_90;
  if (local_90 == (LSTMParams *)0x0) {
    puVar5 = Specification::_LSTMParams_default_instance_;
  }
  Specification::LSTMParams::LSTMParams(&local_70,(LSTMParams *)puVar5);
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  local_130._M_string_length = 0;
  local_130.field_2._M_local_buf[0] = '\0';
  if (local_e8._24_4_ == 3) {
    if (local_b8 == 3) {
      local_138 = local_88;
      local_150 = local_80;
      local_140 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<CoreML::Specification::LSTMWeightParams>::TypeHandler>
                            (&local_a8,0);
      local_148 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<CoreML::Specification::LSTMWeightParams>::TypeHandler>
                            (&local_a8,1);
      puVar5 = (undefined1 *)local_140->inputgateweightmatrix_;
      if ((WeightParams *)puVar5 == (WeightParams *)0x0) {
        puVar5 = Specification::_WeightParams_default_instance_;
      }
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"Bidirectional LSTM","");
      pvVar3 = (layer->name_).tagged_ptr_.ptr_;
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_170,"forward input gate weight matrix","");
      local_138 = local_138 * local_150;
      validateGeneralWeightParams
                (__return_storage_ptr__,(WeightParams *)puVar5,local_138,local_150,&local_190,
                 (string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_170);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      }
      bVar4 = Result::good(__return_storage_ptr__);
      if (bVar4) {
        pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != paVar1) {
          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
        }
        puVar5 = (undefined1 *)local_140->forgetgateweightmatrix_;
        if ((WeightParams *)puVar5 == (WeightParams *)0x0) {
          puVar5 = Specification::_WeightParams_default_instance_;
        }
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_190,"Bidirectional LSTM","");
        pvVar3 = (layer->name_).tagged_ptr_.ptr_;
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_170,"forward forget gate weight matrix","");
        validateGeneralWeightParams
                  (__return_storage_ptr__,(WeightParams *)puVar5,local_138,local_150,&local_190,
                   (string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_170);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
        }
        bVar4 = Result::good(__return_storage_ptr__);
        if (bVar4) {
          pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar2 != paVar1) {
            operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
          }
          puVar5 = (undefined1 *)local_140->blockinputweightmatrix_;
          if ((WeightParams *)puVar5 == (WeightParams *)0x0) {
            puVar5 = Specification::_WeightParams_default_instance_;
          }
          local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_190,"Bidirectional LSTM","");
          pvVar3 = (layer->name_).tagged_ptr_.ptr_;
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_170,"forward block input gate weight matrix","");
          validateGeneralWeightParams
                    (__return_storage_ptr__,(WeightParams *)puVar5,local_138,local_150,&local_190,
                     (string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_170);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != &local_190.field_2) {
            operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
          }
          bVar4 = Result::good(__return_storage_ptr__);
          if (bVar4) {
            pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar2 != paVar1) {
              operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
            }
            puVar5 = (undefined1 *)local_140->outputgateweightmatrix_;
            if ((WeightParams *)puVar5 == (WeightParams *)0x0) {
              puVar5 = Specification::_WeightParams_default_instance_;
            }
            local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_190,"Bidirectional LSTM","");
            pvVar3 = (layer->name_).tagged_ptr_.ptr_;
            local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_170,"forward output gate weight matrix","");
            validateGeneralWeightParams
                      (__return_storage_ptr__,(WeightParams *)puVar5,local_138,local_150,&local_190,
                       (string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_170);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_170._M_dataplus._M_p != &local_170.field_2) {
              operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_190._M_dataplus._M_p != &local_190.field_2) {
              operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1
                             );
            }
            bVar4 = Result::good(__return_storage_ptr__);
            if (bVar4) {
              pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar2 != paVar1) {
                operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
              }
              puVar5 = (undefined1 *)local_140->inputgaterecursionmatrix_;
              if ((WeightParams *)puVar5 == (WeightParams *)0x0) {
                puVar5 = Specification::_WeightParams_default_instance_;
              }
              local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_190,"Bidirectional LSTM","");
              pvVar3 = (layer->name_).tagged_ptr_.ptr_;
              local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_170,"forward input gate recursion matrix","");
              local_110 = local_150 * local_150;
              validateGeneralWeightParams
                        (__return_storage_ptr__,(WeightParams *)puVar5,local_110,local_150,
                         &local_190,(string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_170);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_170._M_dataplus._M_p != &local_170.field_2) {
                operator_delete(local_170._M_dataplus._M_p,
                                local_170.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_190._M_dataplus._M_p != &local_190.field_2) {
                operator_delete(local_190._M_dataplus._M_p,
                                local_190.field_2._M_allocated_capacity + 1);
              }
              bVar4 = Result::good(__return_storage_ptr__);
              if (bVar4) {
                pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)pcVar2 != paVar1) {
                  operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                }
                puVar5 = (undefined1 *)local_140->forgetgaterecursionmatrix_;
                if ((WeightParams *)puVar5 == (WeightParams *)0x0) {
                  puVar5 = Specification::_WeightParams_default_instance_;
                }
                local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_190,"Bidirectional LSTM","");
                pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_170,"forward forget gate recursion matrix","");
                validateGeneralWeightParams
                          (__return_storage_ptr__,(WeightParams *)puVar5,local_110,local_150,
                           &local_190,(string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_170);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_170._M_dataplus._M_p != &local_170.field_2) {
                  operator_delete(local_170._M_dataplus._M_p,
                                  local_170.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_190._M_dataplus._M_p != &local_190.field_2) {
                  operator_delete(local_190._M_dataplus._M_p,
                                  local_190.field_2._M_allocated_capacity + 1);
                }
                bVar4 = Result::good(__return_storage_ptr__);
                if (bVar4) {
                  pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)pcVar2 != paVar1) {
                    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                  }
                  puVar5 = (undefined1 *)local_140->blockinputrecursionmatrix_;
                  if ((WeightParams *)puVar5 == (WeightParams *)0x0) {
                    puVar5 = Specification::_WeightParams_default_instance_;
                  }
                  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_190,"Bidirectional LSTM","");
                  pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_170,"forward block input gate recursion matrix","");
                  validateGeneralWeightParams
                            (__return_storage_ptr__,(WeightParams *)puVar5,local_110,local_150,
                             &local_190,(string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_170);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_170._M_dataplus._M_p != &local_170.field_2) {
                    operator_delete(local_170._M_dataplus._M_p,
                                    local_170.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_190._M_dataplus._M_p != &local_190.field_2) {
                    operator_delete(local_190._M_dataplus._M_p,
                                    local_190.field_2._M_allocated_capacity + 1);
                  }
                  bVar4 = Result::good(__return_storage_ptr__);
                  if (bVar4) {
                    pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)pcVar2 != paVar1) {
                      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                    }
                    puVar5 = (undefined1 *)local_140->outputgaterecursionmatrix_;
                    if ((WeightParams *)puVar5 == (WeightParams *)0x0) {
                      puVar5 = Specification::_WeightParams_default_instance_;
                    }
                    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_190,"Bidirectional LSTM","");
                    pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_170,"forward output gate recursion matrix","");
                    validateGeneralWeightParams
                              (__return_storage_ptr__,(WeightParams *)puVar5,local_110,local_150,
                               &local_190,(string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_170)
                    ;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_170._M_dataplus._M_p != &local_170.field_2) {
                      operator_delete(local_170._M_dataplus._M_p,
                                      local_170.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_190._M_dataplus._M_p != &local_190.field_2) {
                      operator_delete(local_190._M_dataplus._M_p,
                                      local_190.field_2._M_allocated_capacity + 1);
                    }
                    bVar4 = Result::good(__return_storage_ptr__);
                    if (bVar4) {
                      pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)pcVar2 != paVar1) {
                        operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                      }
                      puVar5 = (undefined1 *)local_148->inputgateweightmatrix_;
                      if ((WeightParams *)puVar5 == (WeightParams *)0x0) {
                        puVar5 = Specification::_WeightParams_default_instance_;
                      }
                      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_190,"Bidirectional LSTM","");
                      pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_170,"backward input gate weight matrix","");
                      validateGeneralWeightParams
                                (__return_storage_ptr__,(WeightParams *)puVar5,local_138,local_150,
                                 &local_190,(string *)((ulong)pvVar3 & 0xfffffffffffffffe),
                                 &local_170);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_170._M_dataplus._M_p != &local_170.field_2) {
                        operator_delete(local_170._M_dataplus._M_p,
                                        local_170.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_190._M_dataplus._M_p != &local_190.field_2) {
                        operator_delete(local_190._M_dataplus._M_p,
                                        local_190.field_2._M_allocated_capacity + 1);
                      }
                      bVar4 = Result::good(__return_storage_ptr__);
                      if (bVar4) {
                        pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)pcVar2 != paVar1) {
                          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                        }
                        puVar5 = (undefined1 *)local_148->forgetgateweightmatrix_;
                        if ((WeightParams *)puVar5 == (WeightParams *)0x0) {
                          puVar5 = Specification::_WeightParams_default_instance_;
                        }
                        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_190,"Bidirectional LSTM","");
                        pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_170,"backward forget gate weight matrix","");
                        validateGeneralWeightParams
                                  (__return_storage_ptr__,(WeightParams *)puVar5,local_138,local_150
                                   ,&local_190,(string *)((ulong)pvVar3 & 0xfffffffffffffffe),
                                   &local_170);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_170._M_dataplus._M_p != &local_170.field_2) {
                          operator_delete(local_170._M_dataplus._M_p,
                                          local_170.field_2._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_190._M_dataplus._M_p != &local_190.field_2) {
                          operator_delete(local_190._M_dataplus._M_p,
                                          local_190.field_2._M_allocated_capacity + 1);
                        }
                        bVar4 = Result::good(__return_storage_ptr__);
                        if (bVar4) {
                          pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)pcVar2 != paVar1) {
                            operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                          }
                          puVar5 = (undefined1 *)local_148->blockinputweightmatrix_;
                          if ((WeightParams *)puVar5 == (WeightParams *)0x0) {
                            puVar5 = Specification::_WeightParams_default_instance_;
                          }
                          local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_190,"Bidirectional LSTM","");
                          pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_170,"backward block input gate weight matrix",
                                     "");
                          validateGeneralWeightParams
                                    (__return_storage_ptr__,(WeightParams *)puVar5,local_138,
                                     local_150,&local_190,
                                     (string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_170);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_170._M_dataplus._M_p != &local_170.field_2) {
                            operator_delete(local_170._M_dataplus._M_p,
                                            local_170.field_2._M_allocated_capacity + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_190._M_dataplus._M_p != &local_190.field_2) {
                            operator_delete(local_190._M_dataplus._M_p,
                                            local_190.field_2._M_allocated_capacity + 1);
                          }
                          bVar4 = Result::good(__return_storage_ptr__);
                          if (bVar4) {
                            pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)pcVar2 != paVar1) {
                              operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                            }
                            puVar5 = (undefined1 *)local_148->outputgateweightmatrix_;
                            if ((WeightParams *)puVar5 == (WeightParams *)0x0) {
                              puVar5 = Specification::_WeightParams_default_instance_;
                            }
                            local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_190,"Bidirectional LSTM","");
                            pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                            local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_170,"backward output gate weight matrix","")
                            ;
                            validateGeneralWeightParams
                                      (__return_storage_ptr__,(WeightParams *)puVar5,local_138,
                                       local_150,&local_190,
                                       (string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_170);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_170._M_dataplus._M_p != &local_170.field_2) {
                              operator_delete(local_170._M_dataplus._M_p,
                                              local_170.field_2._M_allocated_capacity + 1);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_190._M_dataplus._M_p != &local_190.field_2) {
                              operator_delete(local_190._M_dataplus._M_p,
                                              local_190.field_2._M_allocated_capacity + 1);
                            }
                            bVar4 = Result::good(__return_storage_ptr__);
                            if (bVar4) {
                              pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)pcVar2 != paVar1) {
                                operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                              }
                              puVar5 = (undefined1 *)local_148->inputgaterecursionmatrix_;
                              if ((WeightParams *)puVar5 == (WeightParams *)0x0) {
                                puVar5 = Specification::_WeightParams_default_instance_;
                              }
                              local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&local_190,"Bidirectional LSTM","");
                              pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                              local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&local_170,"backward input gate recursion matrix"
                                         ,"");
                              validateGeneralWeightParams
                                        (__return_storage_ptr__,(WeightParams *)puVar5,local_110,
                                         local_150,&local_190,
                                         (string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_170);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_170._M_dataplus._M_p != &local_170.field_2) {
                                operator_delete(local_170._M_dataplus._M_p,
                                                local_170.field_2._M_allocated_capacity + 1);
                              }
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_190._M_dataplus._M_p != &local_190.field_2) {
                                operator_delete(local_190._M_dataplus._M_p,
                                                local_190.field_2._M_allocated_capacity + 1);
                              }
                              bVar4 = Result::good(__return_storage_ptr__);
                              if (bVar4) {
                                pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)pcVar2 != paVar1) {
                                  operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                                }
                                puVar5 = (undefined1 *)local_148->forgetgaterecursionmatrix_;
                                if ((WeightParams *)puVar5 == (WeightParams *)0x0) {
                                  puVar5 = Specification::_WeightParams_default_instance_;
                                }
                                local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)&local_190,"Bidirectional LSTM","");
                                pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                                local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)&local_170,
                                           "backward forget gate recursion matrix","");
                                validateGeneralWeightParams
                                          (__return_storage_ptr__,(WeightParams *)puVar5,local_110,
                                           local_150,&local_190,
                                           (string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_170
                                          );
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_170._M_dataplus._M_p != &local_170.field_2) {
                                  operator_delete(local_170._M_dataplus._M_p,
                                                  local_170.field_2._M_allocated_capacity + 1);
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_190._M_dataplus._M_p != &local_190.field_2) {
                                  operator_delete(local_190._M_dataplus._M_p,
                                                  local_190.field_2._M_allocated_capacity + 1);
                                }
                                bVar4 = Result::good(__return_storage_ptr__);
                                if (bVar4) {
                                  pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)pcVar2 != paVar1) {
                                    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                                  }
                                  puVar5 = (undefined1 *)local_148->blockinputrecursionmatrix_;
                                  if ((WeightParams *)puVar5 == (WeightParams *)0x0) {
                                    puVar5 = Specification::_WeightParams_default_instance_;
                                  }
                                  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)&local_190,"Bidirectional LSTM","");
                                  pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                                  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)&local_170,
                                             "backward block input gate recursion matrix","");
                                  validateGeneralWeightParams
                                            (__return_storage_ptr__,(WeightParams *)puVar5,local_110
                                             ,local_150,&local_190,
                                             (string *)((ulong)pvVar3 & 0xfffffffffffffffe),
                                             &local_170);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_170._M_dataplus._M_p != &local_170.field_2) {
                                    operator_delete(local_170._M_dataplus._M_p,
                                                    local_170.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_190._M_dataplus._M_p != &local_190.field_2) {
                                    operator_delete(local_190._M_dataplus._M_p,
                                                    local_190.field_2._M_allocated_capacity + 1);
                                  }
                                  bVar4 = Result::good(__return_storage_ptr__);
                                  if (bVar4) {
                                    pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)pcVar2 != paVar1) {
                                      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                                    }
                                    puVar5 = (undefined1 *)local_148->outputgaterecursionmatrix_;
                                    if ((WeightParams *)puVar5 == (WeightParams *)0x0) {
                                      puVar5 = Specification::_WeightParams_default_instance_;
                                    }
                                    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)&local_190,"Bidirectional LSTM","");
                                    pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                                    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)&local_170,
                                               "backward output gate recursion matrix","");
                                    validateGeneralWeightParams
                                              (__return_storage_ptr__,(WeightParams *)puVar5,
                                               local_110,local_150,&local_190,
                                               (string *)((ulong)pvVar3 & 0xfffffffffffffffe),
                                               &local_170);
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_170._M_dataplus._M_p != &local_170.field_2) {
                                      operator_delete(local_170._M_dataplus._M_p,
                                                      local_170.field_2._M_allocated_capacity + 1);
                                    }
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_190._M_dataplus._M_p != &local_190.field_2) {
                                      operator_delete(local_190._M_dataplus._M_p,
                                                      local_190.field_2._M_allocated_capacity + 1);
                                    }
                                    bVar4 = Result::good(__return_storage_ptr__);
                                    if (bVar4) {
                                      pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)pcVar2 != paVar1) {
                                        operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                                      }
                                      puVar5 = (undefined1 *)local_90;
                                      if (local_90 == (LSTMParams *)0x0) {
                                        puVar5 = Specification::_LSTMParams_default_instance_;
                                      }
                                      if (((LSTMParams *)puVar5)->hasbiasvectors_ == true) {
                                        puVar5 = (undefined1 *)local_140->inputgatebiasvector_;
                                        if ((WeightParams *)puVar5 == (WeightParams *)0x0) {
                                          puVar5 = Specification::_WeightParams_default_instance_;
                                        }
                                        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_190,"Bidirectional LSTM","");
                                        pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                                        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_170,
                                                   "forward input gate bias vector","");
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,(WeightParams *)puVar5,
                                                   local_150,1,&local_190,
                                                   (string *)((ulong)pvVar3 & 0xfffffffffffffffe),
                                                   &local_170);
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_170._M_dataplus._M_p != &local_170.field_2) {
                                          operator_delete(local_170._M_dataplus._M_p,
                                                          local_170.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_190._M_dataplus._M_p != &local_190.field_2) {
                                          operator_delete(local_190._M_dataplus._M_p,
                                                          local_190.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        bVar4 = Result::good(__return_storage_ptr__);
                                        if (!bVar4) goto LAB_00344af0;
                                        pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus.
                                                 _M_p;
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)pcVar2 != paVar1) {
                                          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                                        }
                                        puVar5 = (undefined1 *)local_140->forgetgatebiasvector_;
                                        if ((WeightParams *)puVar5 == (WeightParams *)0x0) {
                                          puVar5 = Specification::_WeightParams_default_instance_;
                                        }
                                        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_190,"Bidirectional LSTM","");
                                        pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                                        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_170,
                                                   "forward forget gate bias vector","");
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,(WeightParams *)puVar5,
                                                   local_150,1,&local_190,
                                                   (string *)((ulong)pvVar3 & 0xfffffffffffffffe),
                                                   &local_170);
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_170._M_dataplus._M_p != &local_170.field_2) {
                                          operator_delete(local_170._M_dataplus._M_p,
                                                          local_170.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_190._M_dataplus._M_p != &local_190.field_2) {
                                          operator_delete(local_190._M_dataplus._M_p,
                                                          local_190.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        bVar4 = Result::good(__return_storage_ptr__);
                                        if (!bVar4) goto LAB_00344af0;
                                        pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus.
                                                 _M_p;
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)pcVar2 != paVar1) {
                                          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                                        }
                                        puVar5 = (undefined1 *)local_140->blockinputbiasvector_;
                                        if ((WeightParams *)puVar5 == (WeightParams *)0x0) {
                                          puVar5 = Specification::_WeightParams_default_instance_;
                                        }
                                        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_190,"Bidirectional LSTM","");
                                        pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                                        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_170,
                                                   "forward block input bias vector","");
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,(WeightParams *)puVar5,
                                                   local_150,1,&local_190,
                                                   (string *)((ulong)pvVar3 & 0xfffffffffffffffe),
                                                   &local_170);
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_170._M_dataplus._M_p != &local_170.field_2) {
                                          operator_delete(local_170._M_dataplus._M_p,
                                                          local_170.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_190._M_dataplus._M_p != &local_190.field_2) {
                                          operator_delete(local_190._M_dataplus._M_p,
                                                          local_190.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        bVar4 = Result::good(__return_storage_ptr__);
                                        if (!bVar4) goto LAB_00344af0;
                                        pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus.
                                                 _M_p;
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)pcVar2 != paVar1) {
                                          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                                        }
                                        puVar5 = (undefined1 *)local_140->outputgatebiasvector_;
                                        if ((WeightParams *)puVar5 == (WeightParams *)0x0) {
                                          puVar5 = Specification::_WeightParams_default_instance_;
                                        }
                                        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_190,"Bidirectional LSTM","");
                                        pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                                        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_170,
                                                   "forward output gate bias vector","");
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,(WeightParams *)puVar5,
                                                   local_150,1,&local_190,
                                                   (string *)((ulong)pvVar3 & 0xfffffffffffffffe),
                                                   &local_170);
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_170._M_dataplus._M_p != &local_170.field_2) {
                                          operator_delete(local_170._M_dataplus._M_p,
                                                          local_170.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_190._M_dataplus._M_p != &local_190.field_2) {
                                          operator_delete(local_190._M_dataplus._M_p,
                                                          local_190.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        bVar4 = Result::good(__return_storage_ptr__);
                                        if (!bVar4) goto LAB_00344af0;
                                        pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus.
                                                 _M_p;
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)pcVar2 != paVar1) {
                                          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                                        }
                                        puVar5 = (undefined1 *)local_148->inputgatebiasvector_;
                                        if ((WeightParams *)puVar5 == (WeightParams *)0x0) {
                                          puVar5 = Specification::_WeightParams_default_instance_;
                                        }
                                        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_190,"Bidirectional LSTM","");
                                        pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                                        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_170,
                                                   "backward input gate bias vector","");
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,(WeightParams *)puVar5,
                                                   local_150,1,&local_190,
                                                   (string *)((ulong)pvVar3 & 0xfffffffffffffffe),
                                                   &local_170);
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_170._M_dataplus._M_p != &local_170.field_2) {
                                          operator_delete(local_170._M_dataplus._M_p,
                                                          local_170.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_190._M_dataplus._M_p != &local_190.field_2) {
                                          operator_delete(local_190._M_dataplus._M_p,
                                                          local_190.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        bVar4 = Result::good(__return_storage_ptr__);
                                        if (!bVar4) goto LAB_00344af0;
                                        pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus.
                                                 _M_p;
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)pcVar2 != paVar1) {
                                          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                                        }
                                        puVar5 = (undefined1 *)local_148->forgetgatebiasvector_;
                                        if ((WeightParams *)puVar5 == (WeightParams *)0x0) {
                                          puVar5 = Specification::_WeightParams_default_instance_;
                                        }
                                        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_190,"Bidirectional LSTM","");
                                        pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                                        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_170,
                                                   "backward forget gate bias vector","");
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,(WeightParams *)puVar5,
                                                   local_150,1,&local_190,
                                                   (string *)((ulong)pvVar3 & 0xfffffffffffffffe),
                                                   &local_170);
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_170._M_dataplus._M_p != &local_170.field_2) {
                                          operator_delete(local_170._M_dataplus._M_p,
                                                          local_170.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_190._M_dataplus._M_p != &local_190.field_2) {
                                          operator_delete(local_190._M_dataplus._M_p,
                                                          local_190.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        bVar4 = Result::good(__return_storage_ptr__);
                                        if (!bVar4) goto LAB_00344af0;
                                        pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus.
                                                 _M_p;
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)pcVar2 != paVar1) {
                                          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                                        }
                                        puVar5 = (undefined1 *)local_148->blockinputbiasvector_;
                                        if ((WeightParams *)puVar5 == (WeightParams *)0x0) {
                                          puVar5 = Specification::_WeightParams_default_instance_;
                                        }
                                        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_190,"Bidirectional LSTM","");
                                        pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                                        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_170,
                                                   "backward block input bias vector","");
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,(WeightParams *)puVar5,
                                                   local_150,1,&local_190,
                                                   (string *)((ulong)pvVar3 & 0xfffffffffffffffe),
                                                   &local_170);
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_170._M_dataplus._M_p != &local_170.field_2) {
                                          operator_delete(local_170._M_dataplus._M_p,
                                                          local_170.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_190._M_dataplus._M_p != &local_190.field_2) {
                                          operator_delete(local_190._M_dataplus._M_p,
                                                          local_190.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        bVar4 = Result::good(__return_storage_ptr__);
                                        if (!bVar4) goto LAB_00344af0;
                                        pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus.
                                                 _M_p;
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)pcVar2 != paVar1) {
                                          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                                        }
                                        puVar5 = (undefined1 *)local_148->outputgatebiasvector_;
                                        if ((WeightParams *)puVar5 == (WeightParams *)0x0) {
                                          puVar5 = Specification::_WeightParams_default_instance_;
                                        }
                                        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_190,"Bidirectional LSTM","");
                                        pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                                        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_170,
                                                   "backward output gate bias vector","");
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,(WeightParams *)puVar5,
                                                   local_150,1,&local_190,
                                                   (string *)((ulong)pvVar3 & 0xfffffffffffffffe),
                                                   &local_170);
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_170._M_dataplus._M_p != &local_170.field_2) {
                                          operator_delete(local_170._M_dataplus._M_p,
                                                          local_170.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_190._M_dataplus._M_p != &local_190.field_2) {
                                          operator_delete(local_190._M_dataplus._M_p,
                                                          local_190.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        bVar4 = Result::good(__return_storage_ptr__);
                                        if (!bVar4) goto LAB_00344af0;
                                        pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus.
                                                 _M_p;
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)pcVar2 != paVar1) {
                                          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                                        }
                                      }
                                      if (local_90 == (LSTMParams *)0x0) {
                                        local_90 = (LSTMParams *)
                                                   Specification::_LSTMParams_default_instance_;
                                      }
                                      if (local_90->haspeepholevectors_ == true) {
                                        puVar5 = (undefined1 *)local_140->inputgatepeepholevector_;
                                        if ((WeightParams *)puVar5 == (WeightParams *)0x0) {
                                          puVar5 = Specification::_WeightParams_default_instance_;
                                        }
                                        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_190,"Bidirectional LSTM","");
                                        pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                                        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_170,
                                                   "forward input gate peephole vector","");
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,(WeightParams *)puVar5,
                                                   local_150,1,&local_190,
                                                   (string *)((ulong)pvVar3 & 0xfffffffffffffffe),
                                                   &local_170);
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_170._M_dataplus._M_p != &local_170.field_2) {
                                          operator_delete(local_170._M_dataplus._M_p,
                                                          local_170.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_190._M_dataplus._M_p != &local_190.field_2) {
                                          operator_delete(local_190._M_dataplus._M_p,
                                                          local_190.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        bVar4 = Result::good(__return_storage_ptr__);
                                        if (!bVar4) goto LAB_00344af0;
                                        pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus.
                                                 _M_p;
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)pcVar2 != paVar1) {
                                          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                                        }
                                        puVar5 = (undefined1 *)local_140->forgetgatepeepholevector_;
                                        if ((WeightParams *)puVar5 == (WeightParams *)0x0) {
                                          puVar5 = Specification::_WeightParams_default_instance_;
                                        }
                                        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_190,"Bidirectional LSTM","");
                                        pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                                        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_170,
                                                   "forward forget gate peephole vector","");
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,(WeightParams *)puVar5,
                                                   local_150,1,&local_190,
                                                   (string *)((ulong)pvVar3 & 0xfffffffffffffffe),
                                                   &local_170);
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_170._M_dataplus._M_p != &local_170.field_2) {
                                          operator_delete(local_170._M_dataplus._M_p,
                                                          local_170.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_190._M_dataplus._M_p != &local_190.field_2) {
                                          operator_delete(local_190._M_dataplus._M_p,
                                                          local_190.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        bVar4 = Result::good(__return_storage_ptr__);
                                        if (!bVar4) goto LAB_00344af0;
                                        pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus.
                                                 _M_p;
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)pcVar2 != paVar1) {
                                          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                                        }
                                        puVar5 = (undefined1 *)local_140->outputgatepeepholevector_;
                                        if ((WeightParams *)puVar5 == (WeightParams *)0x0) {
                                          puVar5 = Specification::_WeightParams_default_instance_;
                                        }
                                        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_190,"Bidirectional LSTM","");
                                        pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                                        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_170,
                                                   "forward output gate peephole vector","");
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,(WeightParams *)puVar5,
                                                   local_150,1,&local_190,
                                                   (string *)((ulong)pvVar3 & 0xfffffffffffffffe),
                                                   &local_170);
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_170._M_dataplus._M_p != &local_170.field_2) {
                                          operator_delete(local_170._M_dataplus._M_p,
                                                          local_170.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_190._M_dataplus._M_p != &local_190.field_2) {
                                          operator_delete(local_190._M_dataplus._M_p,
                                                          local_190.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        bVar4 = Result::good(__return_storage_ptr__);
                                        if (!bVar4) goto LAB_00344af0;
                                        pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus.
                                                 _M_p;
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)pcVar2 != paVar1) {
                                          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                                        }
                                        puVar5 = (undefined1 *)local_148->inputgatepeepholevector_;
                                        if ((WeightParams *)puVar5 == (WeightParams *)0x0) {
                                          puVar5 = Specification::_WeightParams_default_instance_;
                                        }
                                        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_190,"Bidirectional LSTM","");
                                        pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                                        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_170,
                                                   "backward input gate peephole vector","");
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,(WeightParams *)puVar5,
                                                   local_150,1,&local_190,
                                                   (string *)((ulong)pvVar3 & 0xfffffffffffffffe),
                                                   &local_170);
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_170._M_dataplus._M_p != &local_170.field_2) {
                                          operator_delete(local_170._M_dataplus._M_p,
                                                          local_170.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_190._M_dataplus._M_p != &local_190.field_2) {
                                          operator_delete(local_190._M_dataplus._M_p,
                                                          local_190.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        bVar4 = Result::good(__return_storage_ptr__);
                                        if (!bVar4) goto LAB_00344af0;
                                        pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus.
                                                 _M_p;
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)pcVar2 != paVar1) {
                                          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                                        }
                                        puVar5 = (undefined1 *)local_148->forgetgatepeepholevector_;
                                        if ((WeightParams *)puVar5 == (WeightParams *)0x0) {
                                          puVar5 = Specification::_WeightParams_default_instance_;
                                        }
                                        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_190,"Bidirectional LSTM","");
                                        pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                                        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_170,
                                                   "backward forget gate peephole vector","");
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,(WeightParams *)puVar5,
                                                   local_150,1,&local_190,
                                                   (string *)((ulong)pvVar3 & 0xfffffffffffffffe),
                                                   &local_170);
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_170._M_dataplus._M_p != &local_170.field_2) {
                                          operator_delete(local_170._M_dataplus._M_p,
                                                          local_170.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_190._M_dataplus._M_p != &local_190.field_2) {
                                          operator_delete(local_190._M_dataplus._M_p,
                                                          local_190.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        bVar4 = Result::good(__return_storage_ptr__);
                                        if (!bVar4) goto LAB_00344af0;
                                        pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus.
                                                 _M_p;
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)pcVar2 != paVar1) {
                                          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                                        }
                                        puVar5 = (undefined1 *)local_148->outputgatepeepholevector_;
                                        if ((WeightParams *)puVar5 == (WeightParams *)0x0) {
                                          puVar5 = Specification::_WeightParams_default_instance_;
                                        }
                                        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_190,"Bidirectional LSTM","");
                                        pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                                        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_170,
                                                   "backward output gate peephole vector","");
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,(WeightParams *)puVar5,
                                                   local_150,1,&local_190,
                                                   (string *)((ulong)pvVar3 & 0xfffffffffffffffe),
                                                   &local_170);
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_170._M_dataplus._M_p != &local_170.field_2) {
                                          operator_delete(local_170._M_dataplus._M_p,
                                                          local_170.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_190._M_dataplus._M_p != &local_190.field_2) {
                                          operator_delete(local_190._M_dataplus._M_p,
                                                          local_190.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        bVar4 = Result::good(__return_storage_ptr__);
                                        if (!bVar4) goto LAB_00344af0;
                                        pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus.
                                                 _M_p;
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)pcVar2 != paVar1) {
                                          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                                        }
                                      }
                                      Result::Result(__return_storage_ptr__);
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      goto LAB_00344af0;
    }
    std::operator+(&local_170,"Bidirectional LSTM layer:",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_170);
  }
  else {
    std::operator+(&local_170,"Bidirectional LSTM layer:",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_170);
  }
  psVar8 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_190.field_2._M_allocated_capacity = *psVar8;
    local_190.field_2._8_8_ = plVar6[3];
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  }
  else {
    local_190.field_2._M_allocated_capacity = *psVar8;
    local_190._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_190._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_130,(string *)&local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_130);
LAB_00344af0:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,
                    CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                             local_130.field_2._M_local_buf[0]) + 1);
  }
  Specification::LSTMParams::~LSTMParams(&local_70);
  Specification::BiDirectionalLSTMLayerParams::~BiDirectionalLSTMLayerParams
            ((BiDirectionalLSTMLayerParams *)local_e8);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateBiDirectionalLSTMLayer(const Specification::NeuralNetworkLayer& layer) {
    // Must specify hidden states
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 5));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 5, 5));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "BiDirectionalLSTM", blobNameToRank));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "BiDirectionalLSTM", 5, 5, blobNameToRank));
    }

    for (const auto& activation : layer.bidirectionallstm().activationsforwardlstm()) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRecurrentActivationParams(activation));
    }
    for (const auto& activation : layer.bidirectionallstm().activationsbackwardlstm()) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRecurrentActivationParams(activation));
    }

    // Validate common LSTM params and ensure that all weight field types are consistent
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateLSTMWeightParams(layer.unidirectionallstm().weightparams(), layer.unidirectionallstm().params()));

    Specification::BiDirectionalLSTMLayerParams recurrent = layer.bidirectionallstm();
    Specification::LSTMParams lstmParams = recurrent.params();
    std::string err;

    if (recurrent.activationsforwardlstm_size() != 3) {
        err = std::string("Bidirectional LSTM layer:" + layer.name() + " forward lstm must provide 3 activations");
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    if (recurrent.activationsbackwardlstm_size() != 3){
        err = std::string("Bidirectional LSTM layer:" + layer.name() + " backward lstm must provide 3 activations");
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    // Verify weights and biases sizes
    uint64_t h = recurrent.outputvectorsize();
    uint64_t x = recurrent.inputvectorsize();
    const Specification::LSTMWeightParams& weightParamsF = recurrent.weightparams(0);
    const Specification::LSTMWeightParams& weightParamsB = recurrent.weightparams(1);

    // Check forward weight matrices' sizes
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.inputgateweightmatrix(), h*x, h,
                                                                  "Bidirectional LSTM", layer.name(), "forward input gate weight matrix"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.forgetgateweightmatrix(), h*x, h,
                                                                  "Bidirectional LSTM", layer.name(), "forward forget gate weight matrix"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.blockinputweightmatrix(), h*x, h,
                                                                  "Bidirectional LSTM", layer.name(), "forward block input gate weight matrix"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.outputgateweightmatrix(), h*x, h,
                                                                  "Bidirectional LSTM", layer.name(), "forward output gate weight matrix"));

    // Check forward recursion matrices' sizes
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.inputgaterecursionmatrix(), h*h, h,
                                                                  "Bidirectional LSTM", layer.name(), "forward input gate recursion matrix"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.forgetgaterecursionmatrix(), h*h, h,
                                                                  "Bidirectional LSTM", layer.name(), "forward forget gate recursion matrix"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.blockinputrecursionmatrix(), h*h, h,
                                                                  "Bidirectional LSTM", layer.name(), "forward block input gate recursion matrix"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.outputgaterecursionmatrix(), h*h, h,
                                                                  "Bidirectional LSTM", layer.name(), "forward output gate recursion matrix"));
    // Check backward weight matrices' sizes
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.inputgateweightmatrix(), h*x, h,
                                                                  "Bidirectional LSTM", layer.name(), "backward input gate weight matrix"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.forgetgateweightmatrix(), h*x, h,
                                                                  "Bidirectional LSTM", layer.name(), "backward forget gate weight matrix"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.blockinputweightmatrix(), h*x, h,
                                                                  "Bidirectional LSTM", layer.name(), "backward block input gate weight matrix"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.outputgateweightmatrix(), h*x, h,
                                                                  "Bidirectional LSTM", layer.name(), "backward output gate weight matrix"));

    // Check backward recursion matrices' sizes
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.inputgaterecursionmatrix(), h*h, h,
                                                                  "Bidirectional LSTM", layer.name(), "backward input gate recursion matrix"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.forgetgaterecursionmatrix(), h*h, h,
                                                                  "Bidirectional LSTM", layer.name(), "backward forget gate recursion matrix"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.blockinputrecursionmatrix(), h*h, h,
                                                                  "Bidirectional LSTM", layer.name(), "backward block input gate recursion matrix"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.outputgaterecursionmatrix(), h*h, h,
                                                                  "Bidirectional LSTM", layer.name(), "backward output gate recursion matrix"));

    // Check bias vectors
    if (recurrent.params().hasbiasvectors()) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.inputgatebiasvector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "forward input gate bias vector"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.forgetgatebiasvector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "forward forget gate bias vector"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.blockinputbiasvector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "forward block input bias vector"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.outputgatebiasvector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "forward output gate bias vector"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.inputgatebiasvector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "backward input gate bias vector"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.forgetgatebiasvector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "backward forget gate bias vector"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.blockinputbiasvector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "backward block input bias vector"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.outputgatebiasvector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "backward output gate bias vector"));
    }
    // Check peephole vectors
    if (recurrent.params().haspeepholevectors()){
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.inputgatepeepholevector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "forward input gate peephole vector"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.forgetgatepeepholevector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "forward forget gate peephole vector"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.outputgatepeepholevector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "forward output gate peephole vector"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.inputgatepeepholevector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "backward input gate peephole vector"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.forgetgatepeepholevector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "backward forget gate peephole vector"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.outputgatepeepholevector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "backward output gate peephole vector"));
    }
    return Result();
}